

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

type fmt::v5::
     format_to<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char[3],int>
               (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> out,
               char (*format_str) [3],int *args)

{
  type tVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>_2
  in_R8;
  type args_00;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>,_int>
  as;
  ulong local_38 [3];
  basic_string_view<char> local_20;
  
  local_38[0] = (ulong)(uint)*args;
  local_20 = to_string_view<char>(*format_str);
  args_00.field_1.values_ = in_R8.values_;
  args_00.types_ = (unsigned_long_long)local_38;
  tVar1 = vformat_to<fmt::v5::basic_string_view<char>,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    ((v5 *)out.container,(list<char,_std::allocator<char>_> *)&local_20,
                     format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>,int>
                     ::TYPES,args_00);
  return (type)tVar1.container;
}

Assistant:

format_to(OutputIt out, const S &format_str, const Args &... args) {
  internal::check_format_string<Args...>(format_str);
  typedef typename format_context_t<OutputIt, FMT_CHAR(S)>::type context;
  format_arg_store<context, Args...> as{args...};
  return vformat_to(out, to_string_view(format_str),
                    basic_format_args<context>(as));
}